

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Ps(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int fBest;
  int c;
  Gps_Par_t *pPars;
  Gps_Par_t Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  bVar1 = false;
  Pars.pDumpFile = (char *)argv;
  memset((Gps_Par_t *)&pPars,0,0x30);
  Extra_UtilGetoptReset();
LAB_0029fee9:
  iVar2 = Extra_UtilGetopt(argc,(char **)Pars.pDumpFile,"Dtpcnlmaszxbh");
  if (iVar2 == -1) {
    if (bVar1) {
      if (pAbc->pGiaBest == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Ps(): There is no AIG.\n");
        return 1;
      }
      Gia_ManPrintStats(pAbc->pGiaBest,(Gps_Par_t *)&pPars);
    }
    else {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Ps(): There is no AIG.\n");
        return 1;
      }
      Gia_ManPrintStats(pAbc->pGia,(Gps_Par_t *)&pPars);
    }
    return 0;
  }
  switch(iVar2) {
  case 0x44:
    if (globalUtilOptind < argc) {
      Pars._32_8_ = *(undefined8 *)(Pars.pDumpFile + (long)globalUtilOptind * 8);
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0029fee9;
    }
    Abc_Print(-1,"Command line switch \"-D\" should be followed by a file name.\n");
    break;
  default:
    break;
  case 0x61:
    Pars.fLutProf = Pars.fLutProf ^ 1;
    goto LAB_0029fee9;
  case 0x62:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_0029fee9;
  case 99:
    Pars.fTents = Pars.fTents ^ 1;
    goto LAB_0029fee9;
  case 0x68:
    break;
  case 0x6c:
    Pars.fCut = Pars.fCut ^ 1;
    goto LAB_0029fee9;
  case 0x6d:
    Pars.fNpn = Pars.fNpn ^ 1;
    goto LAB_0029fee9;
  case 0x6e:
    Pars.fSwitch = Pars.fSwitch ^ 1;
    goto LAB_0029fee9;
  case 0x70:
    pPars._4_4_ = pPars._4_4_ ^ 1;
    goto LAB_0029fee9;
  case 0x73:
    Pars.fMiter = Pars.fMiter ^ 1;
    goto LAB_0029fee9;
  case 0x74:
    pPars._0_4_ = (uint)pPars ^ 1;
    goto LAB_0029fee9;
  case 0x78:
    Pars.fSkipMap = Pars.fSkipMap ^ 1;
    goto LAB_0029fee9;
  case 0x7a:
    goto switchD_0029ff2f_caseD_7a;
  }
  Abc_Print(-2,"usage: &ps [-tpcnlmaszxbh] [-D file]\n");
  Abc_Print(-2,"\t          prints stats of the current AIG\n");
  pcVar3 = "no";
  if ((uint)pPars != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-t      : toggle printing BMC tents [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (pPars._4_4_ != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-p      : toggle printing switching activity [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fTents != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-c      : toggle printing the size of frontier cut [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fSwitch != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-n      : toggle printing NPN classes of functions [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fCut != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-l      : toggle printing LUT size profile [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fNpn != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-m      : toggle printing MUX/XOR statistics [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fLutProf != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-a      : toggle printing miter statistics [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fMiter != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-s      : toggle printing slack distribution [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fMuxXor != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-z      : skip mapping statistics even if mapped [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (Pars.fSkipMap != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-n      : toggle using no color in the printout [default = %s]\n",pcVar3);
  pcVar3 = "no";
  if (bVar1) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-x      : toggle printing saved AIG statistics [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-D file : file name to dump statistics [default = none]\n");
  Abc_Print(-2,"\t-h      : print the command usage\n");
  return 1;
switchD_0029ff2f_caseD_7a:
  Pars.fMuxXor = Pars.fMuxXor ^ 1;
  goto LAB_0029fee9;
}

Assistant:

int Abc_CommandAbc9Ps( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gps_Par_t Pars, * pPars = &Pars;
    int c, fBest = 0;
    memset( pPars, 0, sizeof(Gps_Par_t) );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Dtpcnlmaszxbh" ) ) != EOF )
    {
        switch ( c )
        {
        case 't':
            pPars->fTents ^= 1;
            break;
        case 'p':
            pPars->fSwitch ^= 1;
            break;
        case 'c':
            pPars->fCut ^= 1;
            break;
        case 'n':
            pPars->fNpn ^= 1;
            break;
        case 'l':
            pPars->fLutProf ^= 1;
            break;
        case 'm':
            pPars->fMuxXor ^= 1;
            break;
        case 'a':
            pPars->fMiter ^= 1;
            break;
        case 's':
            pPars->fSlacks ^= 1;
            break;
        case 'z':
            pPars->fSkipMap ^= 1;
            break;
        case 'x':
            pPars->fNoColor ^= 1;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pDumpFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'b':
            fBest ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fBest )
    {
        if ( pAbc->pGiaBest == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Ps(): There is no AIG.\n" );
            return 1;
        }
        Gia_ManPrintStats( pAbc->pGiaBest, pPars );
    }
    else
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Ps(): There is no AIG.\n" );
            return 1;
        }
        Gia_ManPrintStats( pAbc->pGia, pPars );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &ps [-tpcnlmaszxbh] [-D file]\n" );
    Abc_Print( -2, "\t          prints stats of the current AIG\n" );
    Abc_Print( -2, "\t-t      : toggle printing BMC tents [default = %s]\n",                pPars->fTents? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle printing switching activity [default = %s]\n",       pPars->fSwitch? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle printing the size of frontier cut [default = %s]\n", pPars->fCut? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle printing NPN classes of functions [default = %s]\n", pPars->fNpn? "yes": "no" );
    Abc_Print( -2, "\t-l      : toggle printing LUT size profile [default = %s]\n",         pPars->fLutProf? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle printing MUX/XOR statistics [default = %s]\n",       pPars->fMuxXor? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle printing miter statistics [default = %s]\n",         pPars->fMiter? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle printing slack distribution [default = %s]\n",       pPars->fSlacks? "yes": "no" );
    Abc_Print( -2, "\t-z      : skip mapping statistics even if mapped [default = %s]\n",   pPars->fSkipMap? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle using no color in the printout [default = %s]\n",    pPars->fNoColor? "yes": "no" );
    Abc_Print( -2, "\t-x      : toggle printing saved AIG statistics [default = %s]\n",     fBest? "yes": "no" );
    Abc_Print( -2, "\t-D file : file name to dump statistics [default = none]\n" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}